

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_8xxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint local_20;
  int disp8;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[2]) {
  case 0:
    sh4asm_txt_movb_r0_a_disp4_rn(em,*quads,quads[1]);
    break;
  case 1:
    sh4asm_txt_movw_r0_a_disp4_rn(em,*quads << 1,quads[1]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 4:
    sh4asm_txt_movb_a_disp4_rm_r0(em,*quads,quads[1]);
    break;
  case 5:
    sh4asm_txt_movw_a_disp4_rm_r0(em,*quads << 1,quads[1]);
    break;
  case 8:
    sh4asm_txt_cmpeq_imm8_r0(em,quads[1] << 4 | *quads);
    break;
  case 9:
    local_20 = quads[1] << 4 | *quads;
    if ((local_20 & 0x80) != 0) {
      local_20 = local_20 | 0xffffff00;
    }
    sh4asm_txt_bt_disp8_pc(em,local_20 * 2 + 4,pc);
    break;
  case 0xb:
    local_20 = quads[1] << 4 | *quads;
    if ((local_20 & 0x80) != 0) {
      local_20 = local_20 | 0xffffff00;
    }
    sh4asm_txt_bf_disp8_pc(em,local_20 * 2 + 4,pc);
    break;
  case 0xd:
    local_20 = quads[1] << 4 | *quads;
    if ((local_20 & 0x80) != 0) {
      local_20 = local_20 | 0xffffff00;
    }
    sh4asm_txt_bts_disp8_pc(em,local_20 * 2 + 4,pc);
    break;
  case 0xf:
    local_20 = quads[1] << 4 | *quads;
    if ((local_20 & 0x80) != 0) {
      local_20 = local_20 | 0xffffff00;
    }
    sh4asm_txt_bfs_disp8_pc(em,local_20 * 2 + 4,pc);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_8xxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xff00
    int disp8;
    switch (quads[2]) {
    case 0:
        sh4asm_txt_movb_r0_a_disp4_rn(em, quads[0], quads[1]);
        break;
    case 1:
        sh4asm_txt_movw_r0_a_disp4_rn(em, quads[0] << 1, quads[1]);
        break;
    case 4:
        sh4asm_txt_movb_a_disp4_rm_r0(em, quads[0], quads[1]);
        break;
    case 5:
        sh4asm_txt_movw_a_disp4_rm_r0(em, quads[0] << 1, quads[1]);
        break;
    case 8:
        sh4asm_txt_cmpeq_imm8_r0(em, (quads[1] << 4) | quads[0]);
        break;
    case 9:
        disp8 = (quads[1] << 4) | quads[0];
        if (disp8 & (1 << 7))
            disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
        sh4asm_txt_bt_disp8_pc(em, 2 * disp8 + 4, pc);
        break;
    case 11:
        disp8 = (quads[1] << 4) | quads[0];
        if (disp8 & (1 << 7))
            disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
        sh4asm_txt_bf_disp8_pc(em, 2 * disp8 + 4, pc);
        break;
    case 13:
        disp8 = (quads[1] << 4) | quads[0];
        if (disp8 & (1 << 7))
            disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
        sh4asm_txt_bts_disp8_pc(em, 2 * disp8 + 4, pc);
        break;
    case 15:
        disp8 = (quads[1] << 4) | quads[0];
        if (disp8 & (1 << 7))
            disp8 |= ~SH4ASM_BIT_RANGE(0, 7);
        sh4asm_txt_bfs_disp8_pc(em, 2 * disp8 + 4, pc);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}